

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

bool tinyusdz::prim::ReconstructPrim<tinyusdz::SkelAnimation>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               SkelAnimation *skelanim,string *warn,string *err,PrimReconstructOptions *options)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  pointer pcVar3;
  _Base_ptr p_Var4;
  size_type sVar5;
  size_type sVar6;
  ostringstream oVar7;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  undefined8 *puVar11;
  const_iterator cVar12;
  mapped_type *pmVar13;
  _Base_ptr p_Var14;
  size_type sVar15;
  char cVar16;
  long lVar17;
  _Rb_tree_header *p_Var18;
  _Base_ptr p_Var19;
  string *psVar20;
  undefined8 uVar21;
  _Alloc_hider _Var22;
  Property *pPVar23;
  ulong uVar24;
  bool bVar25;
  bool bVar26;
  ParseResult ret_2;
  ParseResult ret;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> dst;
  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> pv;
  string attr_type_name;
  ostringstream ss_e;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
  *in_stack_fffffffffffffb48;
  bool local_4a9;
  char **local_4a0;
  char *local_498;
  char *local_490;
  char local_488;
  undefined7 uStack_487;
  undefined1 local_478 [8];
  _Alloc_hider local_470;
  undefined1 auStack_468 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_460;
  size_type sStack_440;
  undefined8 uStack_438;
  undefined4 local_42c;
  undefined1 local_428 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  undefined1 uStack_3f8;
  undefined7 uStack_3f7;
  undefined1 uStack_3f0;
  SkelAnimation *local_3e0;
  Attribute *local_3d8;
  char local_3d0;
  vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
  local_3c8;
  string local_3b0;
  string local_390;
  _Base_ptr local_370;
  optional<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_> local_368;
  AttrMetas *local_348;
  AttrMetas *local_340;
  ios_base *local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  undefined1 local_2f0 [8];
  undefined1 local_2e8 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  undefined2 local_2d0;
  _Alloc_hider local_2c8;
  pointer local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_2b8 [3];
  ios_base local_280 [16];
  ios_base aiStack_270 [264];
  optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
  *local_168;
  storage_t<tinyusdz::Token> local_160;
  string *local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [48];
  string local_f0 [16];
  long local_e0 [2];
  string local_d0 [16];
  undefined8 local_c0 [2];
  storage_t<tinyusdz::Token> local_b0;
  _Base_ptr *local_90 [2];
  _Base_ptr local_80 [2];
  _Base_ptr local_70;
  _Base_ptr local_68;
  pointer local_60 [2];
  pointer local_50;
  _Base_ptr local_48;
  _Alloc_hider local_40;
  
  local_120._24_8_ = (long)local_120 + 8;
  local_120._8_4_ = 0;
  local_120._16_8_ = (_Link_type)0x0;
  local_120._40_8_ = 0;
  p_Var14 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var18 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
  local_4a9 = (_Rb_tree_header *)p_Var14 == p_Var18;
  local_120._32_8_ = local_120._24_8_;
  if (!local_4a9) {
    local_138._16_8_ = &skelanim->joints;
    local_138._8_8_ = &skelanim->translations;
    local_340 = &(skelanim->rotations)._metas;
    local_138._0_8_ = &(skelanim->rotations)._paths;
    local_338 = aiStack_270;
    local_160._8_8_ = &(skelanim->rotations)._attrib;
    local_348 = &(skelanim->scales)._metas;
    local_160._24_8_ = &(skelanim->scales)._paths;
    local_168 = (optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                 *)&(skelanim->scales)._attrib;
    local_140 = (string *)&skelanim->blendShapes;
    local_160._16_8_ = &skelanim->blendShapeWeights;
    local_160.data._0_8_ = (undefined8)&skelanim->props;
    local_3e0 = skelanim;
    local_370 = &p_Var18->_M_header;
    do {
      local_90[0] = local_80;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_90,*(long *)(p_Var14 + 1),
                 (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
      pPVar23 = (Property *)local_2f0;
      local_2f0 = (undefined1  [8])(local_2e8 + 8);
      ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar23,"joints","");
      local_3d8 = (Attribute *)(p_Var14 + 2);
      (anonymous_namespace)::
      ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                ((ParseResult *)local_478,(_anonymous_namespace_ *)local_120,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_90,(string *)(p_Var14 + 2),pPVar23,(string *)local_138._16_8_,
                 (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> *)
                 in_stack_fffffffffffffb48);
      if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
        operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
      }
      if (local_90[0] != local_80) {
        operator_delete(local_90[0],(ulong)((long)&local_80[0]->_M_color + 1));
      }
      p_Var19 = local_370;
      iVar8 = 0;
      if (((ulong)local_478 & 0xfffffffd) == 0) {
        iVar8 = 3;
        bVar25 = false;
      }
      else {
        bVar25 = true;
        if (local_478._0_4_ != Unmatched) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                     ,0x5a);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_2f0,"ReconstructPrim",0xf);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"():",3);
          poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f0,0xbaf);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
          local_4a0 = &local_490;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_4a0,"Parsing attribute `{}` failed. Error: {}","");
          fmt::format<char[7],std::__cxx11::string>
                    ((string *)local_428,(fmt *)&local_4a0,(string *)"joints",
                     (char (*) [7])&local_470,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar23);
          poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_2f0,(char *)local_428._0_8_,
                              CONCAT62(local_428._10_6_,local_428._8_2_));
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
          pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_428 + 0x10);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428._0_8_
              != pbVar2) {
            operator_delete((void *)local_428._0_8_,CONCAT62(local_428._18_6_,local_428._16_2_) + 1)
            ;
          }
          if (local_4a0 != &local_490) {
            operator_delete(local_4a0,(ulong)(local_490 + 1));
          }
          if (err != (string *)0x0) {
            ::std::__cxx11::stringbuf::str();
            plVar10 = (long *)::std::__cxx11::string::_M_append
                                        ((char *)&local_4a0,(ulong)(err->_M_dataplus)._M_p);
            pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (plVar10 + 2);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10 ==
                pbVar1) {
              pcVar3 = (pbVar1->_M_dataplus)._M_p;
              local_428._16_2_ = SUB82(pcVar3,0);
              local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
              local_428._24_2_ = (undefined2)plVar10[3];
              local_428._26_6_ = (undefined6)((ulong)plVar10[3] >> 0x10);
              local_428._0_8_ = pbVar2;
            }
            else {
              pcVar3 = (pbVar1->_M_dataplus)._M_p;
              local_428._16_2_ = SUB82(pcVar3,0);
              local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
              local_428._0_8_ =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10;
            }
            local_428._8_2_ = (undefined2)plVar10[1];
            local_428._10_6_ = (undefined6)((ulong)plVar10[1] >> 0x10);
            *plVar10 = (long)pbVar1;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)err,(string *)local_428);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428._0_8_
                != pbVar2) {
              operator_delete((void *)local_428._0_8_,
                              CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
            }
            if (local_4a0 != &local_490) {
              operator_delete(local_4a0,(ulong)(local_490 + 1));
            }
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
          ::std::ios_base::~ios_base(local_280);
          iVar8 = 1;
          bVar25 = false;
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470._M_p !=
          &bStack_460) {
        operator_delete(local_470._M_p,(long)bStack_460._M_dataplus._M_p + 1);
      }
      if (bVar25) {
        local_b0.data._0_8_ = (undefined8)((long)&local_b0 + 0x10);
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,*(long *)(p_Var14 + 1),
                   (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
        pPVar23 = (Property *)local_2f0;
        local_2f0 = (undefined1  [8])(local_2e8 + 8);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar23,"translations","");
        (anonymous_namespace)::
        ParseTypedAttribute<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>
                  ((ParseResult *)local_478,(_anonymous_namespace_ *)local_120,
                   (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_b0,&local_3d8->_name,pPVar23,(string *)local_138._8_8_,
                   in_stack_fffffffffffffb48);
        if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
          operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
        }
        if (local_b0.data.__align != (anon_struct_8_0_00000001_for___align)((long)&local_b0 + 0x10))
        {
          operator_delete((void *)local_b0.data._0_8_,local_b0._16_8_ + 1);
        }
        iVar8 = 0;
        if (((ulong)local_478 & 0xfffffffd) == 0) {
          iVar8 = 3;
LAB_0020b1c1:
          bVar25 = false;
        }
        else {
          bVar25 = true;
          if (local_478._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_2f0,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"():",3);
            poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f0,0xbb0);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            local_4a0 = &local_490;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_4a0,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[13],std::__cxx11::string>
                      ((string *)local_428,(fmt *)&local_4a0,(string *)"translations",
                       (char (*) [13])&local_470,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pPVar23)
            ;
            poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_2f0,(char *)local_428._0_8_,
                                CONCAT62(local_428._10_6_,local_428._8_2_));
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_428 + 0x10);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428._0_8_
                != pbVar2) {
              operator_delete((void *)local_428._0_8_,
                              CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
            }
            if (local_4a0 != &local_490) {
              operator_delete(local_4a0,(ulong)(local_490 + 1));
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar10 = (long *)::std::__cxx11::string::_M_append
                                          ((char *)&local_4a0,(ulong)(err->_M_dataplus)._M_p);
              pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (plVar10 + 2);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10 ==
                  pbVar1) {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_428._16_2_ = SUB82(pcVar3,0);
                local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_428._24_2_ = (undefined2)plVar10[3];
                local_428._26_6_ = (undefined6)((ulong)plVar10[3] >> 0x10);
                local_428._0_8_ = pbVar2;
              }
              else {
                pcVar3 = (pbVar1->_M_dataplus)._M_p;
                local_428._16_2_ = SUB82(pcVar3,0);
                local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                local_428._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar10;
              }
              local_428._8_2_ = (undefined2)plVar10[1];
              local_428._10_6_ = (undefined6)((ulong)plVar10[1] >> 0x10);
              *plVar10 = (long)pbVar1;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_428);
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_428._0_8_ != pbVar2) {
                operator_delete((void *)local_428._0_8_,
                                CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
              }
              if (local_4a0 != &local_490) {
                operator_delete(local_4a0,(ulong)(local_490 + 1));
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
            ::std::ios_base::~ios_base(local_280);
            iVar8 = 1;
            goto LAB_0020b1c1;
          }
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_470._M_p !=
            &bStack_460) {
          operator_delete(local_470._M_p,(long)bStack_460._M_dataplus._M_p + 1);
        }
        if (bVar25) {
          local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_310,*(long *)(p_Var14 + 1),
                     (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
          local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"rotations","");
          sVar6 = local_310._M_string_length;
          sVar5 = local_3b0._M_string_length;
          local_498 = &local_488;
          local_490 = (char *)0x0;
          local_488 = '\0';
          sVar15 = local_310._M_string_length;
          if (local_3b0._M_string_length < local_310._M_string_length) {
            sVar15 = local_3b0._M_string_length;
          }
          if (sVar15 == 0) {
            bVar25 = true;
          }
          else {
            iVar8 = bcmp(local_310._M_dataplus._M_p,local_3b0._M_dataplus._M_p,sVar15);
            bVar25 = iVar8 == 0;
          }
          if ((bool)(bVar25 ^ 1U | sVar6 != sVar5)) {
            local_4a0 = (char **)CONCAT44(local_4a0._4_4_,1);
          }
          else {
            if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              local_4a0 = (char **)CONCAT44(local_4a0._4_4_,7);
              local_478 = (undefined1  [8])auStack_468;
              local_428._0_8_ = &DAT_0000003e;
              local_478 = (undefined1  [8])
                          ::std::__cxx11::string::_M_create((ulong *)local_478,(ulong)local_428);
              auStack_468 = (undefined1  [8])local_428._0_8_;
              *(undefined8 *)local_478 = 0x79747265706f7250;
              *(undefined8 *)((long)local_478 + 8) = 0x756d20607d7b6020;
              *(undefined8 *)((long)local_478 + 0x10) = 0x7441206562207473;
              *(undefined8 *)((long)local_478 + 0x18) = 0x2c65747562697274;
              *(undefined8 *)((long)local_478 + 0x20) = 0x6365642074756220;
              *(undefined8 *)((long)local_478 + 0x28) = 0x736120646572616c;
              builtin_strncpy((char *)((long)local_478 + 0x2e),"as Relat",8);
              builtin_strncpy((char *)((long)local_478 + 0x36),"ionship.",8);
              local_470._M_p = (pointer)local_428._0_8_;
              *(char *)((long)local_478 + local_428._0_8_) = '\0';
              fmt::format<std::__cxx11::string>
                        ((string *)local_2f0,(fmt *)local_478,&local_3b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_428._0_8_);
              ::std::__cxx11::string::operator=((string *)&local_498,(string *)local_2f0);
              if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
                operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
              }
              if (local_478 != (undefined1  [8])auStack_468) {
                operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
              }
            }
            if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_138._0_8_,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var14[6]._M_parent);
              local_4a0 = (char **)((ulong)local_4a0 & 0xffffffff00000000);
            }
            Attribute::type_name_abi_cxx11_(&local_390,local_3d8);
            tinyusdz::value::
            TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>::
            type_name_abi_cxx11_();
            if (local_2e8 == (undefined1  [8])local_390._M_string_length) {
              if (local_2e8 == (undefined1  [8])0x0) {
                bVar25 = true;
              }
              else {
                iVar8 = bcmp((void *)local_2f0,local_390._M_dataplus._M_p,(size_t)local_2e8);
                bVar25 = iVar8 == 0;
              }
            }
            else {
              bVar25 = false;
            }
            bVar26 = true;
            if (!bVar25) {
              tinyusdz::value::
              TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
              ::underlying_type_name_abi_cxx11_();
              if (local_68 == (_Base_ptr)local_390._M_string_length) {
                if (local_68 != (_Base_ptr)0x0) {
                  iVar8 = bcmp(local_70,local_390._M_dataplus._M_p,(size_t)local_68);
                  bVar26 = iVar8 == 0;
                }
              }
              else {
                bVar26 = false;
              }
            }
            if ((!bVar25) && (local_70 != (_Base_ptr)local_60)) {
              operator_delete(local_70,(ulong)((long)&(local_60[0]->value)._M_dataplus._M_p + 1));
            }
            if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
              operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
            }
            if (bVar26) {
              iVar8 = *(int *)((long)&p_Var14[0x17]._M_parent + 4);
              if (iVar8 != 1) {
                if (iVar8 == 0) {
                  (local_3e0->rotations)._value_empty = true;
                  AttrMetas::operator=(local_340,(AttrMetas *)(p_Var14 + 7));
                  psVar20 = &local_3b0;
LAB_0020bbd8:
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             psVar20);
                  local_4a0 = (char **)((ulong)local_4a0 & 0xffffffff00000000);
                }
                else {
                  pPVar23 = (Property *)0x25;
                  ::std::__cxx11::string::_M_replace((ulong)&local_498,0,local_490,0x3f9856);
                  local_4a0 = (char **)CONCAT44(local_4a0._4_4_,8);
                }
                goto LAB_0020bbe5;
              }
              if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                if (p_Var14[4]._M_right == (_Base_ptr)0x0) {
                  bVar25 = false;
                }
                else {
                  iVar8 = (**(code **)p_Var14[4]._M_right)();
                  bVar25 = iVar8 == 4;
                }
                if ((bVar25) || ((p_Var14[5]._M_color & _S_black) != _S_red)) {
                  (local_3e0->rotations)._blocked = true;
                }
              }
              if (((char)p_Var14[5]._M_color == _S_red) &&
                 ((((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                    (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 0)) ||
                   ((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                    (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 1)))) &&
                  (p_Var14[5]._M_left == p_Var14[5]._M_parent)))) {
                bVar25 = true;
                bVar26 = false;
              }
              else {
                uStack_3f8 = 0;
                uStack_3f7 = 0;
                uStack_3f0 = 0;
                local_408._M_allocated_capacity = 0;
                local_408._M_local_buf[8] = '\0';
                local_408._9_7_ = 0;
                local_428._16_2_ = 0;
                local_428._18_6_ = 0;
                local_428._24_2_ = 0;
                local_428._0_8_ =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                local_428._8_2_ = 0;
                local_428._10_6_ = 0;
                bVar25 = primvar::PrimVar::is_valid((PrimVar *)&p_Var14[4]._M_parent);
                if (bVar25) {
                  if (((char)p_Var14[5]._M_color == _S_red) &&
                     (((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                       (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 0)) ||
                      ((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                       (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 1)))))) {
                    cVar16 = '\0';
                  }
                  else {
                    primvar::PrimVar::
                    get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                              (&local_368,(PrimVar *)&p_Var14[4]._M_parent);
                    cVar16 = local_368.has_value_;
                    local_3d0 = local_368.has_value_;
                    if (local_368.has_value_ == true) {
                      local_3c8.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start =
                           (pointer)local_368.contained.data._0_8_;
                      local_3c8.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish =
                           (pointer)local_368.contained._8_8_;
                      local_3c8.
                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage =
                           (pointer)local_368.contained._16_8_;
                      local_368.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
                      local_368.contained._8_8_ = 0;
                      local_368.contained._16_8_ = 0;
                      ::std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                      ::operator=((vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                   *)local_428,
                                  (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                   *)&local_3c8);
                      local_428._24_2_ = 1;
                    }
                    if ((local_3d0 == '\x01') &&
                       ((anon_struct_8_0_00000001_for___align)
                        local_3c8.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start !=
                        (anon_struct_8_0_00000001_for___align)0x0)) {
                      operator_delete(local_3c8.
                                      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_3c8.
                                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_3c8.
                                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                    if (cVar16 == '\0') goto LAB_0020ba3d;
                  }
                  else {
                    local_42c = (undefined4)
                                CONCAT71((int7)((ulong)p_Var14[5]._M_left >> 8),local_478[0]);
                    lVar17 = 0;
                    uVar24 = 0;
                    do {
                      if ((char)p_Var14[6]._M_color == _S_black) {
                        tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var14[5]._M_parent);
                      }
                      p_Var4 = p_Var14[5]._M_parent;
                      if (*(char *)((long)&p_Var4[1]._M_color + lVar17) == '\x01') {
                        TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::add_blocked_sample
                                  ((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                    *)&local_408,*(double *)((long)&p_Var4->_M_color + lVar17));
                      }
                      else {
                        tinyusdz::value::Value::
                        get_value<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
                                  (&local_368,(Value *)((long)&p_Var4->_M_parent + lVar17),false);
                        bVar25 = local_368.has_value_;
                        local_3d0 = local_368.has_value_;
                        if (local_368.has_value_ == true) {
                          local_3c8.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start =
                               (pointer)local_368.contained.data._0_8_;
                          local_3c8.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (pointer)local_368.contained._8_8_;
                          local_3c8.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (pointer)local_368.contained._16_8_;
                          local_368.contained.data.__align =
                               (anon_struct_8_0_00000001_for___align)0x0;
                          local_368.contained._8_8_ = 0;
                          local_368.contained._16_8_ = 0;
                          TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                          ::add_sample((TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                                        *)&local_408,*(double *)((long)&p_Var4->_M_color + lVar17),
                                       (vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                        *)&local_3c8);
                        }
                        else {
                          sStack_440 = 0;
                          uStack_438 = 0;
                          bStack_460.field_2._M_allocated_capacity = 0;
                          bStack_460.field_2._8_8_ = 0;
                          bStack_460._M_dataplus._M_p = (pointer)0x0;
                          bStack_460._M_string_length = 0;
                          local_470._M_p = (pointer)0x0;
                          auStack_468 = (undefined1  [8])0x0;
                          local_42c = 0;
                        }
                        if ((local_3d0 == '\x01') &&
                           ((anon_struct_8_0_00000001_for___align)
                            local_3c8.
                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (anon_struct_8_0_00000001_for___align)0x0)) {
                          operator_delete(local_3c8.
                                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_3c8.
                                                super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_3c8.
                                                super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        p_Var19 = local_370;
                        if (bVar25 == false) {
                          local_478[0] = (fmt)(char)local_42c;
                          goto LAB_0020ba59;
                        }
                      }
                      uVar24 = uVar24 + 1;
                      lVar17 = lVar17 + 0x28;
                    } while (uVar24 < (ulong)(((long)p_Var14[5]._M_left - (long)p_Var14[5]._M_parent
                                              >> 3) * -0x3333333333333333));
                    local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
                  }
                  local_478[0] = (fmt)0x1;
                  local_470._M_p = (pointer)local_428._0_8_;
                  auStack_468 = (undefined1  [8])CONCAT62(local_428._10_6_,local_428._8_2_);
                  bStack_460._M_dataplus._M_p = (pointer)CONCAT62(local_428._18_6_,local_428._16_2_)
                  ;
                  local_428._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_428._8_2_ = 0;
                  local_428._10_6_ = 0;
                  local_428._16_2_ = 0;
                  local_428._18_6_ = 0;
                  bStack_460._M_string_length =
                       CONCAT62(bStack_460._M_string_length._2_6_,local_428._24_2_);
                  bStack_460.field_2._M_allocated_capacity = local_408._M_allocated_capacity;
                  bStack_460.field_2._8_8_ = CONCAT71(local_408._9_7_,local_408._M_local_buf[8]);
                  sStack_440 = CONCAT71(uStack_3f7,uStack_3f8);
                  uStack_3f8 = 0;
                  uStack_3f7 = 0;
                  local_408._M_allocated_capacity = 0;
                  local_408._M_local_buf[8] = '\0';
                  local_408._9_7_ = 0;
                  uStack_438 = CONCAT71(uStack_438._1_7_,uStack_3f0);
                }
                else {
LAB_0020ba3d:
                  local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
                  sStack_440 = 0;
                  uStack_438 = 0;
                  bStack_460.field_2._M_allocated_capacity = 0;
                  bStack_460.field_2._8_8_ = 0;
                  bStack_460._M_dataplus._M_p = (pointer)0x0;
                  bStack_460._M_string_length = 0;
                  local_470._M_p = (pointer)0x0;
                  auStack_468 = (undefined1  [8])0x0;
                }
LAB_0020ba59:
                ::std::
                vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                           *)&local_408);
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_428._0_8_ !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  operator_delete((void *)local_428._0_8_,
                                  CONCAT62(local_428._18_6_,local_428._16_2_) - local_428._0_8_);
                }
                local_2f0[0] = (ostringstream)local_478[0];
                if (local_478[0] == (fmt)0x1) {
                  local_2e8 = (undefined1  [8])local_470._M_p;
                  local_2e0._M_allocated_capacity = (size_type)auStack_468;
                  local_2e0._8_8_ = bStack_460._M_dataplus._M_p;
                  bStack_460._M_dataplus._M_p = (pointer)0x0;
                  local_470._M_p = (pointer)0x0;
                  auStack_468 = (undefined1  [8])0x0;
                  local_2d0 = (undefined2)bStack_460._M_string_length;
                  local_2c8._M_p = (pointer)bStack_460.field_2._M_allocated_capacity;
                  local_2c0 = (pointer)bStack_460.field_2._8_8_;
                  aaStack_2b8[0]._M_allocated_capacity = sStack_440;
                  sStack_440 = 0;
                  bStack_460.field_2._M_allocated_capacity = 0;
                  bStack_460.field_2._8_8_ = 0;
                  aaStack_2b8[0]._M_local_buf[8] = (char)uStack_438;
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                    *)&local_470);
                }
                oVar7 = local_2f0[0];
                if (local_2f0[0] == (ostringstream)0x1) {
                  nonstd::optional_lite::
                  optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                  ::operator=((optional<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>>
                               *)local_160._8_8_,
                              (Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                               *)local_2e8);
                }
                else {
                  local_4a0 = (char **)CONCAT44(local_4a0._4_4_,8);
                  pPVar23 = (Property *)0x55;
                  ::std::__cxx11::string::_M_replace((ulong)&local_498,0,local_490,0x3f9b24);
                }
                if (local_2f0[0] == (ostringstream)0x1) {
                  nonstd::optional_lite::detail::
                  storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                  ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                                    *)local_2e8);
                }
                if (oVar7 != (ostringstream)0x0) {
                  AttrMetas::operator=(local_340,(AttrMetas *)(p_Var14 + 7));
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)local_120,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_3b0);
                  local_4a0 = (char **)((ulong)local_4a0 & 0xffffffff00000000);
                }
                bVar26 = true;
                bVar25 = false;
              }
              if (bVar25) {
                if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
                  AttrMetas::operator=(local_340,(AttrMetas *)(p_Var14 + 7));
                  psVar20 = (string *)&local_310;
                  goto LAB_0020bbd8;
                }
                goto LAB_0020bbe5;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p != &local_390.field_2) {
                operator_delete(local_390._M_dataplus._M_p,
                                local_390.field_2._M_allocated_capacity + 1);
              }
              if ((bVar26) || (local_498 == &local_488)) goto LAB_0020bc0a;
              uVar21 = CONCAT71(uStack_487,local_488);
              _Var22._M_p = local_498;
            }
            else {
              local_4a0 = (char **)CONCAT44(local_4a0._4_4_,3);
              ::std::__cxx11::stringstream::stringstream((stringstream *)local_2f0);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_2e8 + 8),"Property type mismatch. ",0x18);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)(local_2e8 + 8),local_3b0._M_dataplus._M_p,
                                  local_3b0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," expects type `",0xf);
              tinyusdz::value::
              TypeTraits<std::vector<tinyusdz::value::quatf,std::allocator<tinyusdz::value::quatf>>>
              ::type_name_abi_cxx11_();
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,(char *)local_478,(long)local_470._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"` but defined as type `",0x17);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar9,local_390._M_dataplus._M_p,local_390._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`",1);
              if (local_478 != (undefined1  [8])auStack_468) {
                operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
              }
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&local_498,(string *)local_478);
              if (local_478 != (undefined1  [8])auStack_468) {
                operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
              }
              ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2f0);
              ::std::ios_base::~ios_base(local_338);
LAB_0020bbe5:
              uVar21 = local_390.field_2._M_allocated_capacity;
              _Var22._M_p = local_390._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390._M_dataplus._M_p == &local_390.field_2) goto LAB_0020bc0a;
            }
            operator_delete(_Var22._M_p,uVar21 + 1);
          }
LAB_0020bc0a:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
            operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_310._M_dataplus._M_p != &local_310.field_2) {
            operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
          }
          iVar8 = 0;
          if (((ulong)local_4a0 & 0xfffffffd) == 0) {
            iVar8 = 3;
LAB_0020be9d:
            bVar25 = false;
          }
          else {
            bVar25 = true;
            if ((int)local_4a0 != 1) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f0,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2f0,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"():",3);
              poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f0,0xbb1);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
              pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (local_428 + 0x10);
              local_428._0_8_ = pbVar2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_428,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[10],std::__cxx11::string>
                        ((string *)local_478,(fmt *)local_428,(string *)"rotations",
                         (char (*) [10])&local_498,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pPVar23);
              poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_2f0,(char *)local_478,(long)local_470._M_p);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
              if (local_478 != (undefined1  [8])auStack_468) {
                operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_428._0_8_ != pbVar2) {
                operator_delete((void *)local_428._0_8_,
                                CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                puVar11 = (undefined8 *)
                          ::std::__cxx11::string::_M_append
                                    (local_428,(ulong)(err->_M_dataplus)._M_p);
                plVar10 = puVar11 + 2;
                if ((long *)*puVar11 == plVar10) {
                  auStack_468 = (undefined1  [8])*plVar10;
                  bStack_460._M_dataplus._M_p = (pointer)puVar11[3];
                  local_478 = (undefined1  [8])auStack_468;
                }
                else {
                  auStack_468 = (undefined1  [8])*plVar10;
                  local_478 = (undefined1  [8])*puVar11;
                }
                local_470._M_p = (pointer)puVar11[1];
                *puVar11 = plVar10;
                puVar11[1] = 0;
                *(undefined1 *)(puVar11 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)local_478);
                if (local_478 != (undefined1  [8])auStack_468) {
                  operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_428._0_8_ != pbVar2) {
                  operator_delete((void *)local_428._0_8_,
                                  CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
              ::std::ios_base::~ios_base(local_280);
              iVar8 = 1;
              goto LAB_0020be9d;
            }
          }
          if (local_498 != &local_488) {
            operator_delete(local_498,CONCAT71(uStack_487,local_488) + 1);
          }
          if (bVar25) {
            local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_330,*(long *)(p_Var14 + 1),
                       (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
            local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"scales","");
            sVar6 = local_330._M_string_length;
            sVar5 = local_3b0._M_string_length;
            local_498 = &local_488;
            local_490 = (char *)0x0;
            local_488 = '\0';
            sVar15 = local_330._M_string_length;
            if (local_3b0._M_string_length < local_330._M_string_length) {
              sVar15 = local_3b0._M_string_length;
            }
            if (sVar15 == 0) {
              bVar25 = true;
            }
            else {
              iVar8 = bcmp(local_330._M_dataplus._M_p,local_3b0._M_dataplus._M_p,sVar15);
              bVar25 = iVar8 == 0;
            }
            if ((bool)(bVar25 ^ 1U | sVar6 != sVar5)) {
              local_4a0 = (char **)CONCAT44(local_4a0._4_4_,1);
            }
            else {
              if (((ulong)p_Var14[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
                local_4a0 = (char **)CONCAT44(local_4a0._4_4_,7);
                local_478 = (undefined1  [8])auStack_468;
                local_428._0_8_ = &DAT_0000003e;
                local_478 = (undefined1  [8])
                            ::std::__cxx11::string::_M_create((ulong *)local_478,(ulong)local_428);
                auStack_468 = (undefined1  [8])local_428._0_8_;
                *(undefined8 *)local_478 = 0x79747265706f7250;
                *(undefined8 *)((long)local_478 + 8) = 0x756d20607d7b6020;
                *(undefined8 *)((long)local_478 + 0x10) = 0x7441206562207473;
                *(undefined8 *)((long)local_478 + 0x18) = 0x2c65747562697274;
                *(undefined8 *)((long)local_478 + 0x20) = 0x6365642074756220;
                *(undefined8 *)((long)local_478 + 0x28) = 0x736120646572616c;
                builtin_strncpy((char *)((long)local_478 + 0x2e),"as Relat",8);
                builtin_strncpy((char *)((long)local_478 + 0x36),"ionship.",8);
                local_470._M_p = (pointer)local_428._0_8_;
                *(char *)((long)local_478 + local_428._0_8_) = '\0';
                fmt::format<std::__cxx11::string>
                          ((string *)local_2f0,(fmt *)local_478,&local_3b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_428._0_8_);
                ::std::__cxx11::string::operator=((string *)&local_498,(string *)local_2f0);
                if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
                  operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
                }
                if (local_478 != (undefined1  [8])auStack_468) {
                  operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                }
              }
              if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           local_160._24_8_,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var14[6]._M_parent);
                local_4a0 = (char **)((ulong)local_4a0 & 0xffffffff00000000);
              }
              Attribute::type_name_abi_cxx11_(&local_390,local_3d8);
              tinyusdz::value::
              TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
              ::type_name_abi_cxx11_();
              if (local_2e8 == (undefined1  [8])local_390._M_string_length) {
                if (local_2e8 == (undefined1  [8])0x0) {
                  bVar25 = true;
                }
                else {
                  iVar8 = bcmp((void *)local_2f0,local_390._M_dataplus._M_p,(size_t)local_2e8);
                  bVar25 = iVar8 == 0;
                }
              }
              else {
                bVar25 = false;
              }
              bVar26 = true;
              if (!bVar25) {
                tinyusdz::value::
                TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ::underlying_type_name_abi_cxx11_();
                if (local_48 == (_Base_ptr)local_390._M_string_length) {
                  if (local_48 != (_Base_ptr)0x0) {
                    iVar8 = bcmp(local_50,local_390._M_dataplus._M_p,(size_t)local_48);
                    bVar26 = iVar8 == 0;
                  }
                }
                else {
                  bVar26 = false;
                }
              }
              if ((!bVar25) && (local_50 != (pointer)&local_40)) {
                operator_delete(local_50,(ulong)(local_40._M_p + 1));
              }
              if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
                operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
              }
              if (bVar26) {
                iVar8 = *(int *)((long)&p_Var14[0x17]._M_parent + 4);
                if (iVar8 != 1) {
                  if (iVar8 == 0) {
                    (local_3e0->scales)._value_empty = true;
                    AttrMetas::operator=(local_348,(AttrMetas *)(p_Var14 + 7));
                    psVar20 = &local_3b0;
LAB_0020c92b:
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_120,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               psVar20);
                    local_4a0 = (char **)((ulong)local_4a0 & 0xffffffff00000000);
                  }
                  else {
                    pPVar23 = (Property *)0x25;
                    ::std::__cxx11::string::_M_replace((ulong)&local_498,0,local_490,0x3f9856);
                    local_4a0 = (char **)CONCAT44(local_4a0._4_4_,8);
                  }
                  goto LAB_0020c938;
                }
                if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                  if (p_Var14[4]._M_right == (_Base_ptr)0x0) {
                    bVar25 = false;
                  }
                  else {
                    iVar8 = (**(code **)p_Var14[4]._M_right)();
                    bVar25 = iVar8 == 4;
                  }
                  if ((bVar25) || ((p_Var14[5]._M_color & _S_black) != _S_red)) {
                    (local_3e0->scales)._blocked = true;
                  }
                }
                if ((((char)p_Var14[5]._M_color == _S_red) &&
                    (((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                      (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 0)) ||
                     ((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                      (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 1)))))) &&
                   (p_Var14[5]._M_left == p_Var14[5]._M_parent)) {
                  bVar25 = true;
                  bVar26 = false;
                }
                else {
                  uStack_3f8 = 0;
                  uStack_3f7 = 0;
                  uStack_3f0 = 0;
                  local_408._M_allocated_capacity = 0;
                  local_408._M_local_buf[8] = '\0';
                  local_408._9_7_ = 0;
                  local_428._16_2_ = 0;
                  local_428._18_6_ = 0;
                  local_428._24_2_ = 0;
                  local_428._0_8_ =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                  local_428._8_2_ = 0;
                  local_428._10_6_ = 0;
                  bVar25 = primvar::PrimVar::is_valid((PrimVar *)&p_Var14[4]._M_parent);
                  if (bVar25) {
                    if (((char)p_Var14[5]._M_color == _S_red) &&
                       (((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                         (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 0)) ||
                        ((p_Var14[4]._M_right != (_Base_ptr)0x0 &&
                         (iVar8 = (**(code **)p_Var14[4]._M_right)(), iVar8 == 1)))))) {
                      cVar16 = '\0';
                    }
                    else {
                      primvar::PrimVar::
                      get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                                ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                  *)&local_368,(PrimVar *)&p_Var14[4]._M_parent);
                      cVar16 = local_368.has_value_;
                      local_3d0 = local_368.has_value_;
                      if (local_368.has_value_ == true) {
                        local_3c8.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start =
                             (pointer)local_368.contained.data._0_8_;
                        local_3c8.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)local_368.contained._8_8_;
                        local_3c8.
                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage =
                             (pointer)local_368.contained._16_8_;
                        local_368.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0
                        ;
                        local_368.contained._8_8_ = 0;
                        local_368.contained._16_8_ = 0;
                        ::std::
                        vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                        ::operator=((vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                     *)local_428,&local_3c8);
                        local_428._24_2_ = 1;
                      }
                      if ((local_3d0 == '\x01') &&
                         ((anon_struct_8_0_00000001_for___align)
                          local_3c8.
                          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start !=
                          (anon_struct_8_0_00000001_for___align)0x0)) {
                        operator_delete(local_3c8.
                                        super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_3c8.
                                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_3c8.
                                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                    }
                    if (p_Var14[5]._M_left == p_Var14[5]._M_parent) {
                      if (cVar16 == '\0') goto LAB_0020c790;
                    }
                    else {
                      local_42c = (undefined4)
                                  CONCAT71((int7)((ulong)p_Var14[5]._M_left >> 8),local_478[0]);
                      lVar17 = 0;
                      uVar24 = 0;
                      do {
                        if ((char)p_Var14[6]._M_color == _S_black) {
                          tinyusdz::value::TimeSamples::update((TimeSamples *)&p_Var14[5]._M_parent)
                          ;
                        }
                        p_Var4 = p_Var14[5]._M_parent;
                        if (*(char *)((long)&p_Var4[1]._M_color + lVar17) == '\x01') {
                          TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                          ::add_blocked_sample
                                    ((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                      *)&local_408,*(double *)((long)&p_Var4->_M_color + lVar17));
                        }
                        else {
                          tinyusdz::value::Value::
                          get_value<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                                    ((optional<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                      *)&local_368,(Value *)((long)&p_Var4->_M_parent + lVar17),
                                     false);
                          bVar25 = local_368.has_value_;
                          local_3d0 = local_368.has_value_;
                          if (local_368.has_value_ == true) {
                            local_3c8.
                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start =
                                 (pointer)local_368.contained.data._0_8_;
                            local_3c8.
                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish =
                                 (pointer)local_368.contained._8_8_;
                            local_3c8.
                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                                 (pointer)local_368.contained._16_8_;
                            local_368.contained.data.__align =
                                 (anon_struct_8_0_00000001_for___align)0x0;
                            local_368.contained._8_8_ = 0;
                            local_368.contained._16_8_ = 0;
                            TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                            ::add_sample((TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                          *)&local_408,*(double *)((long)&p_Var4->_M_color + lVar17)
                                         ,&local_3c8);
                          }
                          else {
                            sStack_440 = 0;
                            uStack_438 = 0;
                            bStack_460.field_2._M_allocated_capacity = 0;
                            bStack_460.field_2._8_8_ = 0;
                            bStack_460._M_dataplus._M_p = (pointer)0x0;
                            bStack_460._M_string_length = 0;
                            local_470._M_p = (pointer)0x0;
                            auStack_468 = (undefined1  [8])0x0;
                            local_42c = 0;
                          }
                          if ((local_3d0 == '\x01') &&
                             ((anon_struct_8_0_00000001_for___align)
                              local_3c8.
                              super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start !=
                              (anon_struct_8_0_00000001_for___align)0x0)) {
                            operator_delete(local_3c8.
                                            super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_3c8.
                                                  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_3c8.
                                                                                                        
                                                  super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          p_Var19 = local_370;
                          if (bVar25 == false) {
                            local_478[0] = (fmt)(char)local_42c;
                            goto LAB_0020c7ac;
                          }
                        }
                        uVar24 = uVar24 + 1;
                        lVar17 = lVar17 + 0x28;
                      } while (uVar24 < (ulong)(((long)p_Var14[5]._M_left -
                                                 (long)p_Var14[5]._M_parent >> 3) *
                                               -0x3333333333333333));
                      local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
                    }
                    local_478[0] = (fmt)0x1;
                    local_470._M_p = (pointer)local_428._0_8_;
                    auStack_468 = (undefined1  [8])CONCAT62(local_428._10_6_,local_428._8_2_);
                    bStack_460._M_dataplus._M_p =
                         (pointer)CONCAT62(local_428._18_6_,local_428._16_2_);
                    local_428._0_8_ =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
                    local_428._8_2_ = 0;
                    local_428._10_6_ = 0;
                    local_428._16_2_ = 0;
                    local_428._18_6_ = 0;
                    bStack_460._M_string_length =
                         CONCAT62(bStack_460._M_string_length._2_6_,local_428._24_2_);
                    bStack_460.field_2._M_allocated_capacity = local_408._M_allocated_capacity;
                    bStack_460.field_2._8_8_ = CONCAT71(local_408._9_7_,local_408._M_local_buf[8]);
                    sStack_440 = CONCAT71(uStack_3f7,uStack_3f8);
                    uStack_3f8 = 0;
                    uStack_3f7 = 0;
                    local_408._M_allocated_capacity = 0;
                    local_408._M_local_buf[8] = '\0';
                    local_408._9_7_ = 0;
                    uStack_438 = CONCAT71(uStack_438._1_7_,uStack_3f0);
                  }
                  else {
LAB_0020c790:
                    local_478 = (undefined1  [8])((ulong)local_478 & 0xffffffffffffff00);
                    sStack_440 = 0;
                    uStack_438 = 0;
                    bStack_460.field_2._M_allocated_capacity = 0;
                    bStack_460.field_2._8_8_ = 0;
                    bStack_460._M_dataplus._M_p = (pointer)0x0;
                    bStack_460._M_string_length = 0;
                    local_470._M_p = (pointer)0x0;
                    auStack_468 = (undefined1  [8])0x0;
                  }
LAB_0020c7ac:
                  ::std::
                  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                  ::~vector((vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                             *)&local_408);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_428._0_8_ !=
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                    operator_delete((void *)local_428._0_8_,
                                    CONCAT62(local_428._18_6_,local_428._16_2_) - local_428._0_8_);
                  }
                  local_2f0[0] = (ostringstream)local_478[0];
                  if (local_478[0] == (fmt)0x1) {
                    local_2e8 = (undefined1  [8])local_470._M_p;
                    local_2e0._M_allocated_capacity = (size_type)auStack_468;
                    local_2e0._8_8_ = bStack_460._M_dataplus._M_p;
                    bStack_460._M_dataplus._M_p = (pointer)0x0;
                    local_470._M_p = (pointer)0x0;
                    auStack_468 = (undefined1  [8])0x0;
                    local_2d0 = (undefined2)bStack_460._M_string_length;
                    local_2c8._M_p = (pointer)bStack_460.field_2._M_allocated_capacity;
                    local_2c0 = (pointer)bStack_460.field_2._8_8_;
                    aaStack_2b8[0]._M_allocated_capacity = sStack_440;
                    sStack_440 = 0;
                    bStack_460.field_2._M_allocated_capacity = 0;
                    bStack_460.field_2._8_8_ = 0;
                    aaStack_2b8[0]._M_local_buf[8] = (char)uStack_438;
                    nonstd::optional_lite::detail::
                    storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                    ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                      *)&local_470);
                  }
                  oVar7 = local_2f0[0];
                  if (local_2f0[0] == (ostringstream)0x1) {
                    nonstd::optional_lite::
                    optional<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>>
                    ::operator=(local_168,
                                (Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                                 *)local_2e8);
                  }
                  else {
                    local_4a0 = (char **)CONCAT44(local_4a0._4_4_,8);
                    pPVar23 = (Property *)0x55;
                    ::std::__cxx11::string::_M_replace((ulong)&local_498,0,local_490,0x3f9b24);
                  }
                  if (local_2f0[0] == (ostringstream)0x1) {
                    nonstd::optional_lite::detail::
                    storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                    ::destruct_value((storage_t<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                                      *)local_2e8);
                  }
                  if (oVar7 != (ostringstream)0x0) {
                    AttrMetas::operator=(local_348,(AttrMetas *)(p_Var14 + 7));
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_120,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_3b0);
                    local_4a0 = (char **)((ulong)local_4a0 & 0xffffffff00000000);
                  }
                  bVar26 = true;
                  bVar25 = false;
                }
                if (bVar25) {
                  if (p_Var14[6]._M_left != p_Var14[6]._M_parent) {
                    AttrMetas::operator=(local_348,(AttrMetas *)(p_Var14 + 7));
                    psVar20 = (string *)&local_330;
                    goto LAB_0020c92b;
                  }
                  goto LAB_0020c938;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_390._M_dataplus._M_p != &local_390.field_2) {
                  operator_delete(local_390._M_dataplus._M_p,
                                  local_390.field_2._M_allocated_capacity + 1);
                }
                if ((bVar26) || (local_498 == &local_488)) goto LAB_0020c95d;
                uVar21 = CONCAT71(uStack_487,local_488);
                _Var22._M_p = local_498;
              }
              else {
                local_4a0 = (char **)CONCAT44(local_4a0._4_4_,3);
                ::std::__cxx11::stringstream::stringstream((stringstream *)local_2f0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_2e8 + 8),"Property type mismatch. ",0x18);
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)(local_2e8 + 8),local_3b0._M_dataplus._M_p,
                                    local_3b0._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," expects type `",0xf);
                tinyusdz::value::
                TypeTraits<std::vector<std::array<tinyusdz::value::half,3ul>,std::allocator<std::array<tinyusdz::value::half,3ul>>>>
                ::type_name_abi_cxx11_();
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,(char *)local_478,(long)local_470._M_p);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          (poVar9,"` but defined as type `",0x17);
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   (poVar9,local_390._M_dataplus._M_p,local_390._M_string_length);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"`",1);
                if (local_478 != (undefined1  [8])auStack_468) {
                  operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                }
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::operator=((string *)&local_498,(string *)local_478);
                if (local_478 != (undefined1  [8])auStack_468) {
                  operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                }
                ::std::__cxx11::stringstream::~stringstream((stringstream *)local_2f0);
                ::std::ios_base::~ios_base(local_338);
LAB_0020c938:
                uVar21 = local_390.field_2._M_allocated_capacity;
                _Var22._M_p = local_390._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_390._M_dataplus._M_p == &local_390.field_2) goto LAB_0020c95d;
              }
              operator_delete(_Var22._M_p,uVar21 + 1);
            }
LAB_0020c95d:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
              operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_330._M_dataplus._M_p != &local_330.field_2) {
              operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1
                             );
            }
            iVar8 = 0;
            if (((ulong)local_4a0 & 0xfffffffd) == 0) {
              iVar8 = 3;
LAB_0020cbf0:
              bVar25 = false;
            }
            else {
              bVar25 = true;
              if ((int)local_4a0 != 1) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f0,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f0,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                           ,0x5a);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_2f0,"ReconstructPrim",0xf);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"():",3);
                poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f0,0xbb2);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_428 + 0x10);
                local_428._0_8_ = pbVar2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_428,"Parsing attribute `{}` failed. Error: {}","");
                fmt::format<char[7],std::__cxx11::string>
                          ((string *)local_478,(fmt *)local_428,(string *)"scales",
                           (char (*) [7])&local_498,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           pPVar23);
                poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_2f0,(char *)local_478,(long)local_470._M_p);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                if (local_478 != (undefined1  [8])auStack_468) {
                  operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_428._0_8_ != pbVar2) {
                  operator_delete((void *)local_428._0_8_,
                                  CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                }
                if (err != (string *)0x0) {
                  ::std::__cxx11::stringbuf::str();
                  puVar11 = (undefined8 *)
                            ::std::__cxx11::string::_M_append
                                      (local_428,(ulong)(err->_M_dataplus)._M_p);
                  plVar10 = puVar11 + 2;
                  if ((long *)*puVar11 == plVar10) {
                    auStack_468 = (undefined1  [8])*plVar10;
                    bStack_460._M_dataplus._M_p = (pointer)puVar11[3];
                    local_478 = (undefined1  [8])auStack_468;
                  }
                  else {
                    auStack_468 = (undefined1  [8])*plVar10;
                    local_478 = (undefined1  [8])*puVar11;
                  }
                  local_470._M_p = (pointer)puVar11[1];
                  *puVar11 = plVar10;
                  puVar11[1] = 0;
                  *(undefined1 *)(puVar11 + 2) = 0;
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_478);
                  if (local_478 != (undefined1  [8])auStack_468) {
                    operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                  }
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_428._0_8_ != pbVar2) {
                    operator_delete((void *)local_428._0_8_,
                                    CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                  }
                }
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
                ::std::ios_base::~ios_base(local_280);
                iVar8 = 1;
                goto LAB_0020cbf0;
              }
            }
            if (local_498 != &local_488) {
              operator_delete(local_498,CONCAT71(uStack_487,local_488) + 1);
            }
            if (bVar25) {
              local_d0._0_8_ = local_c0;
              ::std::__cxx11::string::_M_construct<char*>
                        (local_d0,*(long *)(p_Var14 + 1),
                         (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
              pPVar23 = (Property *)local_2f0;
              local_2f0 = (undefined1  [8])(local_2e8 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>((string *)pPVar23,"blendShapes","");
              (anonymous_namespace)::
              ParseTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                        ((ParseResult *)local_478,(_anonymous_namespace_ *)local_120,
                         (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_d0,&local_3d8->_name,pPVar23,local_140,
                         (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                          *)in_stack_fffffffffffffb48);
              if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
                operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
              }
              if ((undefined8 *)local_d0._0_8_ != local_c0) {
                operator_delete((void *)local_d0._0_8_,local_c0[0] + 1);
              }
              iVar8 = 0;
              if (((ulong)local_478 & 0xfffffffd) == 0) {
                iVar8 = 3;
LAB_0020cf73:
                bVar25 = false;
              }
              else {
                bVar25 = true;
                if (local_478._0_4_ != Unmatched) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f0,"[error]",7);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f0,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_2f0,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,"():",3)
                  ;
                  poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f0,0xbb3);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                  local_4a0 = &local_490;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_4a0,"Parsing attribute `{}` failed. Error: {}","");
                  fmt::format<char[12],std::__cxx11::string>
                            ((string *)local_428,(fmt *)&local_4a0,(string *)0x3f90b2,
                             (char (*) [12])&local_470,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             pPVar23);
                  poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_2f0,(char *)local_428._0_8_,
                                      CONCAT62(local_428._10_6_,local_428._8_2_));
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (local_428 + 0x10);
                  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      local_428._0_8_ != pbVar2) {
                    operator_delete((void *)local_428._0_8_,
                                    CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                  }
                  if (local_4a0 != &local_490) {
                    operator_delete(local_4a0,(ulong)(local_490 + 1));
                  }
                  if (err != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar10 = (long *)::std::__cxx11::string::_M_append
                                                ((char *)&local_4a0,(ulong)(err->_M_dataplus)._M_p);
                    pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (plVar10 + 2);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        *plVar10 == pbVar1) {
                      pcVar3 = (pbVar1->_M_dataplus)._M_p;
                      local_428._16_2_ = SUB82(pcVar3,0);
                      local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                      local_428._24_2_ = (undefined2)plVar10[3];
                      local_428._26_6_ = (undefined6)((ulong)plVar10[3] >> 0x10);
                      local_428._0_8_ = pbVar2;
                    }
                    else {
                      pcVar3 = (pbVar1->_M_dataplus)._M_p;
                      local_428._16_2_ = SUB82(pcVar3,0);
                      local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                      local_428._0_8_ =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *plVar10;
                    }
                    local_428._8_2_ = (undefined2)plVar10[1];
                    local_428._10_6_ = (undefined6)((ulong)plVar10[1] >> 0x10);
                    *plVar10 = (long)pbVar1;
                    plVar10[1] = 0;
                    *(undefined1 *)(plVar10 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)err,(string *)local_428);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_428._0_8_ != pbVar2) {
                      operator_delete((void *)local_428._0_8_,
                                      CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                    }
                    if (local_4a0 != &local_490) {
                      operator_delete(local_4a0,(ulong)(local_490 + 1));
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
                  ::std::ios_base::~ios_base(local_280);
                  iVar8 = 1;
                  goto LAB_0020cf73;
                }
              }
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_470._M_p != &bStack_460) {
                operator_delete(local_470._M_p,(long)bStack_460._M_dataplus._M_p + 1);
              }
              if (bVar25) {
                local_f0._0_8_ = local_e0;
                ::std::__cxx11::string::_M_construct<char*>
                          (local_f0,*(long *)(p_Var14 + 1),
                           (long)&(p_Var14[1]._M_parent)->_M_color + *(long *)(p_Var14 + 1));
                pPVar23 = (Property *)local_2f0;
                local_2f0 = (undefined1  [8])(local_2e8 + 8);
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)pPVar23,"blendShapeWeights","");
                (anonymous_namespace)::ParseTypedAttribute<std::vector<float,std::allocator<float>>>
                          ((ParseResult *)local_478,(_anonymous_namespace_ *)local_120,
                           (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_f0,&local_3d8->_name,pPVar23,(string *)local_160._16_8_,
                           (TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                            *)in_stack_fffffffffffffb48);
                if (local_2f0 != (undefined1  [8])(local_2e8 + 8)) {
                  operator_delete((void *)local_2f0,(ulong)(local_2e0._M_allocated_capacity + 1));
                }
                if ((long *)local_f0._0_8_ != local_e0) {
                  operator_delete((void *)local_f0._0_8_,local_e0[0] + 1);
                }
                iVar8 = 0;
                if (((ulong)local_478 & 0xfffffffd) == 0) {
                  iVar8 = 3;
LAB_0020d2ac:
                  bVar25 = false;
                }
                else {
                  bVar25 = true;
                  if (local_478._0_4_ != Unmatched) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,"():",3);
                    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f0,0xbb4)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                    local_4a0 = &local_490;
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_4a0,"Parsing attribute `{}` failed. Error: {}","");
                    fmt::format<char[18],std::__cxx11::string>
                              ((string *)local_428,(fmt *)&local_4a0,(string *)"blendShapeWeights",
                               (char (*) [18])&local_470,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               pPVar23);
                    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_2f0,(char *)local_428._0_8_,
                                        CONCAT62(local_428._10_6_,local_428._8_2_));
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (local_428 + 0x10);
                    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_428._0_8_ != pbVar2) {
                      operator_delete((void *)local_428._0_8_,
                                      CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                    }
                    if (local_4a0 != &local_490) {
                      operator_delete(local_4a0,(ulong)(local_490 + 1));
                    }
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      plVar10 = (long *)::std::__cxx11::string::_M_append
                                                  ((char *)&local_4a0,(ulong)(err->_M_dataplus)._M_p
                                                  );
                      pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (plVar10 + 2);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          *plVar10 == pbVar1) {
                        pcVar3 = (pbVar1->_M_dataplus)._M_p;
                        local_428._16_2_ = SUB82(pcVar3,0);
                        local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                        local_428._24_2_ = (undefined2)plVar10[3];
                        local_428._26_6_ = (undefined6)((ulong)plVar10[3] >> 0x10);
                        local_428._0_8_ = pbVar2;
                      }
                      else {
                        pcVar3 = (pbVar1->_M_dataplus)._M_p;
                        local_428._16_2_ = SUB82(pcVar3,0);
                        local_428._18_6_ = (undefined6)((ulong)pcVar3 >> 0x10);
                        local_428._0_8_ =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             *plVar10;
                      }
                      local_428._8_2_ = (undefined2)plVar10[1];
                      local_428._10_6_ = (undefined6)((ulong)plVar10[1] >> 0x10);
                      *plVar10 = (long)pbVar1;
                      plVar10[1] = 0;
                      *(undefined1 *)(plVar10 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_428);
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_428._0_8_ != pbVar2) {
                        operator_delete((void *)local_428._0_8_,
                                        CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                      }
                      if (local_4a0 != &local_490) {
                        operator_delete(local_4a0,(ulong)(local_490 + 1));
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
                    ::std::ios_base::~ios_base(local_280);
                    iVar8 = 1;
                    goto LAB_0020d2ac;
                  }
                }
                if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_470._M_p != &bStack_460) {
                  operator_delete(local_470._M_p,(long)bStack_460._M_dataplus._M_p + 1);
                }
                if (bVar25) {
                  p_Var4 = p_Var14 + 1;
                  cVar12 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_120,(key_type *)p_Var4);
                  if (cVar12._M_node == (_Base_ptr)(local_120 + 8)) {
                    pmVar13 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                                            *)local_160.data._0_8_,(key_type *)p_Var4);
                    ::std::__cxx11::string::_M_assign((string *)pmVar13);
                    (pmVar13->_attrib)._varying_authored = (bool)p_Var14[3].field_0x4;
                    (pmVar13->_attrib)._variability = p_Var14[3]._M_color;
                    ::std::__cxx11::string::_M_assign((string *)&(pmVar13->_attrib)._type_name);
                    linb::any::operator=
                              ((any *)&(pmVar13->_attrib)._var,(any *)&p_Var14[4]._M_parent);
                    (pmVar13->_attrib)._var._blocked = SUB41(p_Var14[5]._M_color,0);
                    ::std::
                    vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                    ::operator=(&(pmVar13->_attrib)._var._ts._samples,
                                (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                 *)&p_Var14[5]._M_parent);
                    (pmVar13->_attrib)._var._ts._dirty = SUB41(p_Var14[6]._M_color,0);
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &(pmVar13->_attrib)._paths,
                               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &p_Var14[6]._M_parent);
                    AttrMetas::operator=(&(pmVar13->_attrib)._metas,(AttrMetas *)(p_Var14 + 7));
                    *(_Base_ptr *)&pmVar13->_listOpQual = p_Var14[0x17]._M_parent;
                    (pmVar13->_rel).type = *(Type *)&p_Var14[0x17]._M_left;
                    Path::operator=(&(pmVar13->_rel).targetPath,(Path *)&p_Var14[0x17]._M_right);
                    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &(pmVar13->_rel).targetPathVector,
                               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                               &p_Var14[0x1e]._M_parent);
                    (pmVar13->_rel).listOpQual = p_Var14[0x1f]._M_color;
                    AttrMetas::operator=
                              (&(pmVar13->_rel)._metas,(AttrMetas *)&p_Var14[0x1f]._M_parent);
                    (pmVar13->_rel)._varying_authored = *(bool *)&p_Var14[0x2f]._M_left;
                    ::std::__cxx11::string::_M_assign((string *)&pmVar13->_prop_value_type_name);
                    pmVar13->_has_custom = *(bool *)&p_Var14[0x30]._M_right;
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)local_120,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               p_Var4);
                  }
                  cVar12 = ::std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_120,(key_type *)p_Var4);
                  iVar8 = 0;
                  if (cVar12._M_node == (_Base_ptr)(local_120 + 8)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,"[error]",7);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                               ,0x5a);
                    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2f0,":",1)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,"ReconstructPrim",0xf);
                    ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_2f0,"():",3);
                    poVar9 = (ostream *)::std::ostream::operator<<((ostringstream *)local_2f0,0xbb6)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
                    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_478,"Unsupported/unimplemented property: ",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)p_Var4);
                    poVar9 = ::std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)local_2f0,(char *)local_478,(long)local_470._M_p)
                    ;
                    ::std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
                    if (local_478 != (undefined1  [8])auStack_468) {
                      operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                    }
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      puVar11 = (undefined8 *)
                                ::std::__cxx11::string::_M_append
                                          (local_428,(ulong)(err->_M_dataplus)._M_p);
                      plVar10 = puVar11 + 2;
                      if ((long *)*puVar11 == plVar10) {
                        auStack_468 = (undefined1  [8])*plVar10;
                        bStack_460._M_dataplus._M_p = (pointer)puVar11[3];
                        local_478 = (undefined1  [8])auStack_468;
                      }
                      else {
                        auStack_468 = (undefined1  [8])*plVar10;
                        local_478 = (undefined1  [8])*puVar11;
                      }
                      local_470._M_p = (pointer)puVar11[1];
                      *puVar11 = plVar10;
                      puVar11[1] = 0;
                      *(undefined1 *)(puVar11 + 2) = 0;
                      ::std::__cxx11::string::operator=((string *)err,(string *)local_478);
                      if (local_478 != (undefined1  [8])auStack_468) {
                        operator_delete((void *)local_478,(ulong)((long)auStack_468 + 1));
                      }
                      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_428._0_8_ !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_428 + 0x10)) {
                        operator_delete((void *)local_428._0_8_,
                                        CONCAT62(local_428._18_6_,local_428._16_2_) + 1);
                      }
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
                    ::std::ios_base::~ios_base(local_280);
                    iVar8 = 1;
                  }
                }
              }
            }
          }
        }
      }
      if ((iVar8 != 3) && (iVar8 != 0)) break;
      p_Var14 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var14);
      local_4a9 = p_Var14 == p_Var19;
    } while (!local_4a9);
  }
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_120,(_Link_type)local_120._16_8_);
  return local_4a9;
}

Assistant:

bool ReconstructPrim<SkelAnimation>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    SkelAnimation *skelanim,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)spec;
  (void)warn;
  (void)references;
  (void)options;
  std::set<std::string> table;
  for (auto &prop : properties) {
    PARSE_TYPED_ATTRIBUTE(table, prop, "joints", SkelAnimation, skelanim->joints)
    PARSE_TYPED_ATTRIBUTE(table, prop, "translations", SkelAnimation, skelanim->translations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "rotations", SkelAnimation, skelanim->rotations)
    PARSE_TYPED_ATTRIBUTE(table, prop, "scales", SkelAnimation, skelanim->scales)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapes", SkelAnimation, skelanim->blendShapes)
    PARSE_TYPED_ATTRIBUTE(table, prop, "blendShapeWeights", SkelAnimation, skelanim->blendShapeWeights)
    ADD_PROPERTY(table, prop, Skeleton, skelanim->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}